

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

void Llb_NonlinCutNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Saig_ObjIsLi(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsConst1(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/llb/llb3Image.c"
                        ,0x1f2,"void Llb_NonlinCutNodes_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)")
          ;
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        Llb_NonlinCutNodes_rec(p,pAVar2,vNodes);
        pAVar2 = Aig_ObjFanin1(pObj);
        Llb_NonlinCutNodes_rec(p,pAVar2,vNodes);
        Vec_PtrPush(vNodes,pObj);
      }
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      Llb_NonlinCutNodes_rec(p,pAVar2,vNodes);
    }
  }
  return;
}

Assistant:

void Llb_NonlinCutNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsLi(p, pObj) )
    {
        Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin1(pObj), vNodes);
    Vec_PtrPush( vNodes, pObj );
}